

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void jx9RegisterBuiltInConstant(jx9_vm *pVm)

{
  uint local_14;
  sxu32 n;
  jx9_vm *pVm_local;
  
  for (local_14 = 0; local_14 < 0x7a; local_14 = local_14 + 1) {
    jx9_create_constant(pVm,aBuiltIn[local_14].zName,aBuiltIn[local_14].xExpand,pVm);
  }
  return;
}

Assistant:

JX9_PRIVATE void jx9RegisterBuiltInConstant(jx9_vm *pVm)
{
	sxu32 n;
	/* 
	 * Note that all built-in constants have access to the jx9 virtual machine
	 * that trigger the constant invocation as their private data.
	 */
	for( n = 0 ; n < SX_ARRAYSIZE(aBuiltIn) ; ++n ){
		jx9_create_constant(&(*pVm), aBuiltIn[n].zName, aBuiltIn[n].xExpand, &(*pVm));
	}
}